

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

CService * GetLocalAddress(CService *__return_storage_ptr__,CNode *peer)

{
  _Rb_tree_node_base *this;
  _Rb_tree_color _Var1;
  uint16_t portIn;
  Network NVar2;
  Network NVar3;
  int iVar4;
  _Base_ptr p_Var5;
  uint unaff_EBX;
  _Rb_tree_color _Var6;
  bool bVar7;
  uint16_t unaff_R12W;
  int iVar8;
  undefined8 unaff_R13;
  char *unaff_R14;
  long in_FS_OFFSET;
  UniqueLock<GlobalMutex> criticalblock17;
  uint local_c0;
  uint16_t local_ba;
  char *local_b8;
  undefined8 local_a0;
  undefined8 local_98;
  CNetAddr local_80;
  direct_or_indirect local_60;
  uint local_50;
  undefined8 local_48;
  uint16_t local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (fListen) {
    local_80.m_addr._union.indirect_contents.indirect = (char *)&g_maplocalhost_mutex;
    local_80.m_addr._union.direct[8] = '\0';
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_80);
    if ((_Rb_tree_header *)mapLocalHost._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
        &mapLocalHost._M_t._M_impl.super__Rb_tree_header) {
      bVar7 = false;
      unaff_R12W = 0xe1f0;
      local_a0 = unaff_R13;
      local_b8 = unaff_R14;
    }
    else {
      _Var6 = ~_S_red;
      bVar7 = false;
      iVar8 = -1;
      p_Var5 = mapLocalHost._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        this = p_Var5 + 1;
        NVar2 = CNetAddr::GetNetwork((CNetAddr *)this);
        NVar3 = NET_ONION;
        if (peer->m_inbound_onion == false) {
          NVar3 = CNetAddr::GetNetClass((CNetAddr *)&peer->addr);
        }
        if ((NVar2 == NVar3) ||
           (((1 < *(int *)&p_Var5[1]._M_right - 3U && (peer->m_inbound_onion == false)) &&
            (1 < (peer->addr).super_CService.super_CNetAddr.m_net - NET_ONION)))) {
          _Var1 = p_Var5[2]._M_color;
          iVar4 = CNetAddr::GetReachabilityFrom((CNetAddr *)this,(CNetAddr *)&peer->addr);
          if ((iVar8 < iVar4) || ((iVar4 == iVar8 && ((int)_Var6 < (int)_Var1)))) {
            CService::CService((CService *)&local_60.indirect_contents,(CNetAddr *)this,
                               *(uint16_t *)&p_Var5[2].field_0x4);
            if ((bVar7) && (0x10 < local_c0)) {
              free(local_b8);
            }
            local_b8 = local_60.indirect_contents.indirect;
            local_98 = local_60._8_8_;
            local_c0 = local_50;
            local_a0 = local_48;
            local_ba = local_40;
            bVar7 = true;
            _Var6 = _Var1;
            iVar8 = iVar4;
          }
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != &mapLocalHost._M_t._M_impl.super__Rb_tree_header);
      peer = (CNode *)(ulong)local_c0;
      unaff_R12W = local_ba;
    }
    unaff_EBX = (uint)peer;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_80);
  }
  else {
    bVar7 = false;
    local_a0 = unaff_R13;
    local_b8 = unaff_R14;
  }
  CNetAddr::CNetAddr(&local_80);
  portIn = GetListenPort();
  CService::CService((CService *)&local_60.indirect_contents,&local_80,portIn);
  if (!bVar7) {
    (__return_storage_ptr__->super_CNetAddr).m_addr._union.indirect_contents.indirect =
         local_60.indirect_contents.indirect;
    *(undefined8 *)((long)&(__return_storage_ptr__->super_CNetAddr).m_addr._union + 8) =
         local_60._8_8_;
    (__return_storage_ptr__->super_CNetAddr).m_addr._size = local_50;
    local_50 = 0;
    (__return_storage_ptr__->super_CNetAddr).m_net = (undefined4)local_48;
    (__return_storage_ptr__->super_CNetAddr).m_scope_id = local_48._4_4_;
    __return_storage_ptr__->port = local_40;
  }
  else {
    (__return_storage_ptr__->super_CNetAddr).m_addr._union.indirect_contents.indirect = local_b8;
    *(undefined8 *)((long)&(__return_storage_ptr__->super_CNetAddr).m_addr._union + 8) = local_98;
    (__return_storage_ptr__->super_CNetAddr).m_addr._size = unaff_EBX;
    (__return_storage_ptr__->super_CNetAddr).m_net = (int)local_a0;
    (__return_storage_ptr__->super_CNetAddr).m_scope_id = (int)((ulong)local_a0 >> 0x20);
    __return_storage_ptr__->port = unaff_R12W;
  }
  if (0x10 < local_50) {
    free(local_60.indirect_contents.indirect);
    local_60.indirect_contents.indirect = (char *)0x0;
  }
  if (0x10 < local_80.m_addr._size) {
    free(local_80.m_addr._union.indirect_contents.indirect);
    local_80.m_addr._union.indirect_contents.indirect = (char *)0x0;
  }
  if (bVar7 == true && (!bVar7 && 0x10 < unaff_EBX)) {
    free(local_b8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

CService GetLocalAddress(const CNode& peer)
{
    return GetLocal(peer).value_or(CService{CNetAddr(), GetListenPort()});
}